

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

Fl_Tree_Item * __thiscall Fl_Tree::add(Fl_Tree *this,char *path,Fl_Tree_Item *item)

{
  Fl_Tree_Item *pFVar1;
  char **arr_00;
  char **arr;
  Fl_Tree_Item *item_local;
  char *path_local;
  Fl_Tree *this_local;
  
  if (this->_root == (Fl_Tree_Item *)0x0) {
    pFVar1 = (Fl_Tree_Item *)operator_new(0x88);
    Fl_Tree_Item::Fl_Tree_Item(pFVar1,&this->_prefs);
    this->_root = pFVar1;
    Fl_Tree_Item::parent(this->_root,(Fl_Tree_Item *)0x0);
    Fl_Tree_Item::label(this->_root,"ROOT");
  }
  arr_00 = parse_path(path);
  pFVar1 = Fl_Tree_Item::add(this->_root,&this->_prefs,arr_00,item);
  free_path(arr_00);
  return pFVar1;
}

Assistant:

Fl_Tree_Item* Fl_Tree::add(const char *path, Fl_Tree_Item *item) {
  // Tree has no root? make one
  if ( ! _root ) {
#if FLTK_ABI_VERSION >= 10303
    _root = new Fl_Tree_Item(this);
#else
    _root = new Fl_Tree_Item(_prefs);
#endif
    _root->parent(0);
    _root->label("ROOT");
  } 
  // Find parent item via path
  char **arr = parse_path(path);
  item = _root->add(_prefs, arr, item);
  free_path(arr);
  return(item);
}